

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PollerSelect.cpp
# Opt level: O0

void __thiscall Liby::PollerSelect::removeChanel(PollerSelect *this,Channel *ch)

{
  int iVar1;
  Logger *this_00;
  bool bVar2;
  double __x;
  int fd;
  Channel *ch_local;
  PollerSelect *this_local;
  
  bVar2 = false;
  if (ch != (Channel *)0x0) {
    iVar1 = Channel::get_fd(ch);
    bVar2 = -1 < iVar1;
  }
  if (!bVar2) {
    __assert_fail("ch && ch->get_fd() >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/PollerSelect.cpp"
                  ,0x30,"virtual void Liby::PollerSelect::removeChanel(Channel *)");
  }
  iVar1 = Channel::get_fd(ch);
  (this->rset_).fds_bits[iVar1 / 0x40] =
       (1L << ((byte)((long)iVar1 % 0x40) & 0x3f) ^ 0xffffffffffffffffU) &
       (this->rset_).fds_bits[iVar1 / 0x40];
  (this->wset_).fds_bits[iVar1 / 0x40] =
       (1L << ((byte)((long)iVar1 % 0x40) & 0x3f) ^ 0xffffffffffffffffU) &
       (this->wset_).fds_bits[iVar1 / 0x40];
  (this->eset_).fds_bits[iVar1 / 0x40] =
       (1L << ((byte)((long)iVar1 % 0x40) & 0x3f) ^ 0xffffffffffffffffU) &
       (this->eset_).fds_bits[iVar1 / 0x40];
  this_00 = Logger::getLogger();
  Logger::log(this_00,__x);
  Poller::setChannel(&this->super_Poller,iVar1,(Channel *)0x0);
  if (iVar1 == this->maxfd_) {
    do {
      iVar1 = this->maxfd_ + -1;
      this->maxfd_ = iVar1;
      if (iVar1 == 0) {
        return;
      }
      if (((this->rset_).fds_bits[this->maxfd_ / 0x40] &
          1L << ((byte)((long)this->maxfd_ % 0x40) & 0x3f)) != 0) {
        return;
      }
      if (((this->wset_).fds_bits[this->maxfd_ / 0x40] &
          1L << ((byte)((long)this->maxfd_ % 0x40) & 0x3f)) != 0) {
        return;
      }
    } while (((this->eset_).fds_bits[this->maxfd_ / 0x40] &
             1L << ((byte)((long)this->maxfd_ % 0x40) & 0x3f)) == 0);
  }
  return;
}

Assistant:

void PollerSelect::removeChanel(Channel *ch) {
    assert(ch && ch->get_fd() >= 0);

    int fd = ch->get_fd();
    FD_CLR(fd, &rset_);
    FD_CLR(fd, &wset_);
    FD_CLR(fd, &eset_);

    verbose("try to remove fd %d channel %p", fd, ch);

    setChannel(fd, nullptr);

    if (fd == maxfd_) {
        while (--maxfd_) {
            if (FD_ISSET(maxfd_, &rset_) || FD_ISSET(maxfd_, &wset_) ||
                FD_ISSET(maxfd_, &eset_)) {
                break;
            }
        }
    }
}